

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::registerUniformIfActive
          (QRhiGles2 *this,BlockVariable *var,QByteArray *namePrefix,int binding,int baseOffset,
          GLuint program,ActiveUniformLocationTracker *activeUniformLocations,
          QGles2UniformDescriptionVector *dst)

{
  bool bVar1;
  GLint GVar2;
  char *pcVar3;
  qsizetype qVar4;
  int *piVar5;
  undefined4 in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QByteArray name;
  QGles2UniformDescription uniform;
  QStringBuilder<const_QByteArray_&,_const_QByteArray_&> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int iVar6;
  char *in_stack_ffffffffffffff38;
  QDuplicateTracker<int,_32UL> *this_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char local_88 [32];
  QStringBuilder<const_QByteArray_&,_const_QByteArray_&> local_68;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined4 local_40;
  GLint GStack_3c;
  undefined8 local_38;
  undefined8 local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0x18) == 0x41) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,(char *)in_stack_ffffffffffffff28
              );
    pcVar3 = QByteArray::constData((QByteArray *)0x92a53e);
    QMessageLogger::warning
              (local_28,"Nested structs are not supported at the moment. \'%s\' ignored.",pcVar3);
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    _local_40 = CONCAT44(0xaaaaaaaa,*(undefined4 *)(in_RSI + 0x18));
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = ::operator+((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (QByteArray *)in_stack_ffffffffffffff28);
    ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff28);
    this_00 = *(QDuplicateTracker<int,_32UL> **)(in_RDI + 400);
    QByteArray::constData((QByteArray *)0x92a616);
    GVar2 = QOpenGLFunctions::glGetUniformLocation
                      ((QOpenGLFunctions *)CONCAT44(in_R9D,in_stack_ffffffffffffff40),
                       (GLuint)((ulong)this_00 >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    _local_40 = CONCAT44(GVar2,local_40);
    if ((-1 < GVar2) &&
       (bVar1 = QDuplicateTracker<int,_32UL>::hasSeen
                          (this_00,(int *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30)), !bVar1)) {
      qVar4 = QList<int>::size((QList<int> *)(in_RSI + 0x28));
      if (qVar4 < 2) {
        local_38 = (undefined1 *)CONCAT44(in_R8D + *(int *)(in_RSI + 0x1c),in_ECX);
        local_30 = (undefined1 *)CONCAT44(local_30._4_4_,*(undefined4 *)(in_RSI + 0x20));
        bVar1 = QList<int>::isEmpty((QList<int> *)0x92a6ec);
        if (bVar1) {
          iVar6 = 0;
        }
        else {
          piVar5 = QList<int>::first((QList<int> *)
                                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          iVar6 = *piVar5;
        }
        local_30 = (undefined1 *)CONCAT44(iVar6,(undefined4)local_30);
        QVarLengthArray<QGles2UniformDescription,_8LL>::append
                  ((QVarLengthArray<QGles2UniformDescription,_8LL> *)
                   CONCAT44(in_R9D,in_stack_ffffffffffffff40),(QGles2UniformDescription *)this_00);
      }
      else {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_R9D,in_stack_ffffffffffffff40),this_00->buffer,
                   in_stack_ffffffffffffff34,(char *)in_stack_ffffffffffffff28);
        pcVar3 = QByteArray::constData((QByteArray *)0x92a68e);
        QMessageLogger::warning
                  (local_88,"Array \'%s\' has more than one dimension. This is not supported.",
                   pcVar3);
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x92a743);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::registerUniformIfActive(const QShaderDescription::BlockVariable &var,
                                        const QByteArray &namePrefix,
                                        int binding,
                                        int baseOffset,
                                        GLuint program,
                                        ActiveUniformLocationTracker *activeUniformLocations,
                                        QGles2UniformDescriptionVector *dst)
{
    if (var.type == QShaderDescription::Struct) {
        qWarning("Nested structs are not supported at the moment. '%s' ignored.",
                 var.name.constData());
        return;
    }
    QGles2UniformDescription uniform;
    uniform.type = var.type;
    const QByteArray name = namePrefix + var.name;
    // Here we expect that the OpenGL implementation has proper active uniform
    // handling, meaning that a uniform that is declared but not accessed
    // elsewhere in the code is reported as -1 when querying the location. If
    // that is not the case, it won't break anything, but we'll generate
    // unnecessary glUniform* calls then.
    uniform.glslLocation = f->glGetUniformLocation(program, name.constData());
    if (uniform.glslLocation >= 0 && !activeUniformLocations->hasSeen(uniform.glslLocation)) {
        if (var.arrayDims.size() > 1) {
            qWarning("Array '%s' has more than one dimension. This is not supported.",
                     var.name.constData());
            return;
        }
        uniform.binding = binding;
        uniform.offset = uint(baseOffset + var.offset);
        uniform.size = var.size;
        uniform.arrayDim = var.arrayDims.isEmpty() ? 0 : var.arrayDims.first();
        dst->append(uniform);
    }
}